

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtCore.cpp
# Opt level: O0

JsErrorCode JsGetArrayForEachFunction(JsValueRef *result)

{
  JsErrorCode JVar1;
  JsValueRef *local_10;
  JsValueRef *result_local;
  
  local_10 = result;
  JVar1 = ContextAPINoScriptWrapper_NoRecord<JsGetArrayForEachFunction::__0>
                    ((anon_class_8_1_6971b95b)&local_10,true,false);
  return JVar1;
}

Assistant:

CHAKRA_API
JsGetArrayForEachFunction(_Out_ JsValueRef * result)
{
    return ContextAPINoScriptWrapper_NoRecord([&](Js::ScriptContext *scriptContext) -> JsErrorCode {
        PARAM_NOT_NULL(result);

        *result = scriptContext->GetLibrary()->EnsureArrayPrototypeForEachFunction();

        return JsNoError;
    },
        /*allowInObjectBeforeCollectCallback*/true);
}